

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.c
# Opt level: O0

int json_pointer_result_get_recursive(json_object *obj,char *path,json_pointer_get_result *res)

{
  int iVar1;
  int *piVar2;
  char *path_00;
  int rc;
  char *endp;
  size_t idx;
  json_object *parent_obj;
  json_pointer_get_result *res_local;
  char *path_local;
  json_object *obj_local;
  
  endp = (char *)0x0;
  idx = (size_t)obj;
  parent_obj = (json_object *)res;
  path_local = (char *)obj;
  if (*path == '/') {
    res_local = (json_pointer_get_result *)(path + 1);
    path_00 = strchr((char *)res_local,0x2f);
    if (path_00 != (char *)0x0) {
      *path_00 = '\0';
    }
    obj_local._4_4_ =
         json_pointer_get_single_path
                   ((json_object *)path_local,(char *)res_local,(json_object **)&path_local,
                    (size_t *)&endp);
    if (obj_local._4_4_ == 0) {
      if (path_00 == (char *)0x0) {
        if (parent_obj != (json_object *)0x0) {
          parent_obj->o_type = (undefined4)idx;
          parent_obj->_ref_count = idx._4_4_;
          parent_obj->_to_json_string = (json_object_to_json_string_fn *)path_local;
          iVar1 = json_object_is_type(*(json_object **)parent_obj,json_type_array);
          if (iVar1 == 0) {
            parent_obj->_pb = (printbuf *)res_local;
          }
          else {
            *(int *)&parent_obj->_user_delete = (int)endp;
          }
        }
        obj_local._4_4_ = 0;
      }
      else {
        *path_00 = '/';
        obj_local._4_4_ =
             json_pointer_result_get_recursive
                       ((json_object *)path_local,path_00,(json_pointer_get_result *)parent_obj);
      }
    }
  }
  else {
    res_local = (json_pointer_get_result *)path;
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    obj_local._4_4_ = -1;
  }
  return obj_local._4_4_;
}

Assistant:

static int json_pointer_result_get_recursive(struct json_object *obj, char *path,
                                             struct json_pointer_get_result *res)
{
	struct json_object *parent_obj = obj;
	size_t idx = 0;
	char *endp;
	int rc;

	/* All paths (on each recursion level must have a leading '/' */
	if (path[0] != '/')
	{
		errno = EINVAL;
		return -1;
	}
	path++;

	endp = strchr(path, '/');
	if (endp)
		*endp = '\0';

	/* If we err-ed here, return here */
	if ((rc = json_pointer_get_single_path(obj, path, &obj, &idx)))
		return rc;

	if (endp)
	{
		/* Put the slash back, so that the sanity check passes on next recursion level */
		*endp = '/';
		return json_pointer_result_get_recursive(obj, endp, res);
	}

	/* We should be at the end of the recursion here */
	if (res) {
		res->parent = parent_obj;
		res->obj = obj;
		if (json_object_is_type(res->parent, json_type_array))
			res->index_in_parent = idx;
		else
			res->key_in_parent = path;
	}

	return 0;
}